

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O2

ON__UINT32 Internal_DoubleArrayDataCRC(ON__UINT32 current_remainder,size_t count,double *a)

{
  double *pdVar1;
  undefined1 uVar2;
  endian eVar3;
  undefined1 uVar4;
  undefined1 uVar5;
  undefined1 uVar6;
  double dVar7;
  undefined1 uVar8;
  undefined1 uVar9;
  undefined1 uVar10;
  double x;
  uint local_6c;
  uint local_68;
  uint local_64;
  ulong local_60;
  ulong local_58;
  ulong local_50;
  ulong local_48;
  double local_40;
  double local_38;
  
  eVar3 = ON::Endian();
  if (a != (double *)0x0) {
    pdVar1 = a + count;
    local_38 = ON_DBL_QNAN;
    local_48 = (ulong)ON_DBL_QNAN >> 0x38;
    local_64 = (uint)((ulong)ON_DBL_QNAN >> 8) & 0xffffff;
    local_50 = (ulong)ON_DBL_QNAN >> 0x30;
    local_68 = (uint)((ulong)ON_DBL_QNAN >> 0x10) & 0xffff;
    local_58 = (ulong)ON_DBL_QNAN >> 0x28;
    local_6c = (uint)((ulong)ON_DBL_QNAN >> 0x18) & 0xff;
    local_40 = ON_DBL_QNAN;
    local_60 = (ulong)ON_DBL_QNAN >> 0x20;
    for (; a < pdVar1; a = a + 1) {
      x = *a;
      if ((x != 0.0) || (NAN(x))) {
        if (NAN(x)) {
          x = local_38;
          uVar2 = (undefined1)local_60;
          uVar4 = (undefined1)local_6c;
          uVar5 = (undefined1)local_58;
          uVar6 = (undefined1)local_68;
          uVar8 = (undefined1)local_50;
          uVar9 = (undefined1)local_64;
          uVar10 = (undefined1)local_48;
          dVar7 = local_40;
        }
        else {
          uVar2 = (undefined1)((ulong)x >> 0x20);
          uVar4 = (undefined1)((ulong)x >> 0x18);
          uVar5 = (undefined1)((ulong)x >> 0x28);
          uVar6 = (undefined1)((ulong)x >> 0x10);
          uVar8 = (undefined1)((ulong)x >> 0x30);
          uVar9 = (undefined1)((ulong)x >> 8);
          uVar10 = (undefined1)((ulong)x >> 0x38);
          dVar7 = x;
        }
      }
      else {
        x = 0.0;
        uVar2 = 0;
        uVar4 = 0;
        uVar5 = 0;
        uVar6 = 0;
        uVar8 = 0;
        uVar9 = 0;
        uVar10 = 0;
        dVar7 = 0.0;
      }
      if (eVar3 == big_endian) {
        x = (double)CONCAT35(CONCAT21(CONCAT11(SUB81(dVar7,0),uVar9),uVar6),
                             CONCAT14(uVar4,CONCAT13(uVar2,CONCAT12(uVar5,CONCAT11(uVar8,uVar10)))))
        ;
      }
      current_remainder = ON_CRC32(current_remainder,8,&x);
    }
  }
  return current_remainder;
}

Assistant:

static ON__UINT32 Internal_DoubleArrayDataCRC(
  ON__UINT32 current_remainder,
  size_t count,
  const double* a
)
{
  double x;
  char* byte_swap 
    = (ON::endian::big_endian == ON::Endian()) 
    ? ((char*)&x)
    : nullptr;
  char c;
  if (nullptr != a && count > 0)
  {
    const double* a1 = a + count;
    while (a < a1)
    {
      x = *a++;
      if (0.0 == x)
        x = 0.0; // change -0.0 into +0.0
      else if (false == (x == x))
        x = ON_DBL_QNAN; // change any nan into ON_DBL_QNAN.
      if (nullptr != byte_swap)
      {
        c = byte_swap[0]; byte_swap[0] = byte_swap[7]; byte_swap[7] = c;
        c = byte_swap[1]; byte_swap[1] = byte_swap[6]; byte_swap[6] = c;
        c = byte_swap[2]; byte_swap[2] = byte_swap[5]; byte_swap[5] = c;
        c = byte_swap[3]; byte_swap[3] = byte_swap[4]; byte_swap[4] = c;
      }
      current_remainder = ON_CRC32(current_remainder, sizeof(x), (const void*)&x);
    }
  }
  return current_remainder;
}